

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int writeSuperJournal(Pager *pPager,char *zSuper)

{
  Pgno PVar1;
  sqlite3_io_methods *psVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  i64 jrnlSize;
  undefined1 *local_48;
  undefined1 local_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  iVar4 = 0;
  if ((zSuper != (char *)0x0) && (iVar4 = 0, pPager->journalMode != '\x04')) {
    psVar2 = pPager->jfd->pMethods;
    if (psVar2 != (sqlite3_io_methods *)0x0) {
      pPager->setSuper = '\x01';
      cVar3 = *zSuper;
      if (cVar3 == '\0') {
        uVar7 = 0;
        iVar6 = 0;
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + cVar3;
          cVar3 = zSuper[uVar8 + 1];
          uVar8 = uVar8 + 1;
        } while (cVar3 != '\0');
        uVar7 = uVar8 & 0xffffffff;
      }
      if (pPager->fullSync != '\0') {
        if (pPager->journalOff == 0) {
          lVar5 = 0;
        }
        else {
          lVar5 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
                  (ulong)pPager->sectorSize;
        }
        pPager->journalOff = lVar5;
      }
      lVar5 = pPager->journalOff;
      PVar1 = pPager->lckPgno;
      _local_3c = CONCAT11((char)(PVar1 >> 0x10),(char)(PVar1 >> 0x18));
      _local_3c = CONCAT12((char)(PVar1 >> 8),_local_3c);
      _local_3c = CONCAT13((char)PVar1,_local_3c);
      iVar4 = (*psVar2->xWrite)(pPager->jfd,&local_3c,4,lVar5);
      if (iVar4 == 0) {
        lVar5 = lVar5 + 4;
        iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,zSuper,(int)uVar7,lVar5);
        if (iVar4 == 0) {
          lVar5 = lVar5 + uVar8;
          _local_3c = CONCAT11((char)(uVar7 >> 0x10),(char)(uVar7 >> 0x18));
          _local_3c = CONCAT12((char)(uVar7 >> 8),_local_3c);
          _local_3c = CONCAT13((char)uVar7,_local_3c);
          iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_3c,4,lVar5);
          if (iVar4 == 0) {
            _local_3c = CONCAT11((char)((uint)iVar6 >> 0x10),(char)((uint)iVar6 >> 0x18));
            _local_3c = CONCAT12((char)((uint)iVar6 >> 8),_local_3c);
            _local_3c = CONCAT13((char)iVar6,_local_3c);
            iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,&local_3c,4,lVar5 + 4);
            if (iVar4 == 0) {
              iVar4 = (*pPager->jfd->pMethods->xWrite)(pPager->jfd,aJournalMagic,8,lVar5 + 8);
              if (iVar4 == 0) {
                pPager->journalOff = uVar7 + pPager->journalOff + 0x14;
                iVar4 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_48);
                if (iVar4 == 0) {
                  iVar4 = 0;
                  if (pPager->journalOff < (long)local_48) {
                    iVar4 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,pPager->journalOff);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int writeSuperJournal(Pager *pPager, const char *zSuper){
  int rc;                          /* Return code */
  int nSuper;                      /* Length of string zSuper */
  i64 iHdrOff;                     /* Offset of header in journal file */
  i64 jrnlSize;                    /* Size of journal file on disk */
  u32 cksum = 0;                   /* Checksum of string zSuper */

  assert( pPager->setSuper==0 );
  assert( !pagerUseWal(pPager) );

  if( !zSuper
   || pPager->journalMode==PAGER_JOURNALMODE_MEMORY
   || !isOpen(pPager->jfd)
  ){
    return SQLITE_OK;
  }
  pPager->setSuper = 1;
  assert( pPager->journalHdr <= pPager->journalOff );

  /* Calculate the length in bytes and the checksum of zSuper */
  for(nSuper=0; zSuper[nSuper]; nSuper++){
    cksum += zSuper[nSuper];
  }

  /* If in full-sync mode, advance to the next disk sector before writing
  ** the super-journal name. This is in case the previous page written to
  ** the journal has already been synced.
  */
  if( pPager->fullSync ){
    pPager->journalOff = journalHdrOffset(pPager);
  }
  iHdrOff = pPager->journalOff;

  /* Write the super-journal data to the end of the journal file. If
  ** an error occurs, return the error code to the caller.
  */
  if( (0 != (rc = write32bits(pPager->jfd, iHdrOff, PAGER_SJ_PGNO(pPager))))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, zSuper, nSuper, iHdrOff+4)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nSuper, nSuper)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nSuper+4, cksum)))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, aJournalMagic, 8,
                                 iHdrOff+4+nSuper+8)))
  ){
    return rc;
  }
  pPager->journalOff += (nSuper+20);

  /* If the pager is in persistent-journal mode, then the physical
  ** journal-file may extend past the end of the super-journal name
  ** and 8 bytes of magic data just written to the file. This is
  ** dangerous because the code to rollback a hot-journal file
  ** will not be able to find the super-journal name to determine
  ** whether or not the journal is hot.
  **
  ** Easiest thing to do in this scenario is to truncate the journal
  ** file to the required size.
  */
  if( SQLITE_OK==(rc = sqlite3OsFileSize(pPager->jfd, &jrnlSize))
   && jrnlSize>pPager->journalOff
  ){
    rc = sqlite3OsTruncate(pPager->jfd, pPager->journalOff);
  }
  return rc;
}